

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

bool __thiscall
Assimp::FBX::FBXConverter::GenerateTransformationNodeChain
          (FBXConverter *this,Model *model,string *name,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *output_nodes,
          vector<aiNode_*,_std::allocator<aiNode_*>_> *post_output_nodes)

{
  pointer __n;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 mode;
  bool bVar9;
  PropertyTable *in;
  long lVar10;
  iterator iVar11;
  aiMatrix4x4t<float> *paVar12;
  aiNode *paVar13;
  int iVar14;
  _Rb_tree_color _Var15;
  undefined8 *puVar16;
  undefined1 this_00 [8];
  FBXConverter *pFVar17;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *this_01;
  size_t i;
  ulong uVar18;
  _Rb_tree_color _Var19;
  _Rb_tree_color _Var20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  float in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar21;
  aiVector3t<float> aVar22;
  bool ok;
  undefined1 local_6b8 [8];
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined1 local_6a8 [8];
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  float local_694;
  Model *local_690;
  aiNode *nd;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_668;
  undefined1 local_660 [24];
  undefined1 local_648 [24];
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_630;
  pointer local_628;
  float local_620;
  pointer local_618;
  float local_610;
  pointer local_608;
  float local_600;
  aiMatrix4x4t<float> temp;
  undefined1 local_478 [24];
  Document *apDStack_460 [2];
  float local_450;
  undefined8 local_44c [2];
  undefined4 local_43c;
  aiMatrix4x4t<float> local_438;
  undefined4 local_3f8;
  undefined8 local_3f4;
  ulong uStack_3ec;
  undefined4 local_3e4;
  long local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3d0;
  float local_3cc;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  undefined8 local_3b4;
  ulong uStack_3ac;
  undefined4 local_3a4;
  long local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  float local_38c;
  undefined8 local_388;
  undefined8 local_380;
  undefined4 local_378;
  undefined8 local_374;
  ulong uStack_36c;
  undefined4 local_364;
  long local_360;
  undefined8 uStack_358;
  undefined4 local_350;
  float local_34c;
  undefined8 local_348;
  undefined8 local_340;
  undefined4 local_338;
  undefined8 local_334;
  ulong uStack_32c;
  undefined4 local_324;
  long local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  float local_30c;
  undefined8 local_308;
  undefined8 local_300;
  aiMatrix4x4 local_2f8;
  aiMatrix4x4 local_2b8;
  aiMatrix4x4 local_278;
  undefined4 local_238;
  undefined8 local_234;
  ulong uStack_22c;
  undefined4 local_224;
  long local_220;
  undefined8 uStack_218;
  undefined4 local_210;
  float local_20c;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f4;
  ulong uStack_1ec;
  undefined4 local_1e4;
  long local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  float local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b4;
  ulong uStack_1ac;
  undefined4 local_1a4;
  long local_1a0;
  undefined8 uStack_198;
  undefined4 local_190;
  float local_18c;
  undefined8 local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_174;
  undefined8 uStack_16c;
  float local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  undefined8 local_14c;
  undefined8 uStack_144;
  undefined4 local_13c;
  undefined4 local_138;
  undefined8 local_134;
  ulong uStack_12c;
  undefined4 local_124;
  long local_120;
  undefined8 uStack_118;
  undefined4 local_110;
  float local_10c;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f4;
  ulong uStack_ec;
  undefined4 local_e4;
  long local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  float local_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  aiMatrix4x4 local_b8;
  float local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  
  local_668 = output_nodes;
  local_660._16_8_ = this;
  local_630 = post_output_nodes;
  in = Model::Props(model);
  local_648._0_4_ = Model::RotationOrder(model);
  lVar10 = 0;
  do {
    *(undefined4 *)(local_478 + lVar10) = 0x3f800000;
    *(undefined8 *)(local_478 + lVar10 + 4) = 0;
    *(undefined8 *)(local_478 + lVar10 + 0xc) = 0;
    *(undefined4 *)(local_478 + lVar10 + 0x14) = 0x3f800000;
    *(undefined8 *)((long)apDStack_460 + lVar10) = 0;
    *(undefined8 *)((long)apDStack_460 + lVar10 + 8) = 0;
    *(undefined4 *)((long)&local_450 + lVar10) = 0x3f800000;
    *(undefined8 *)((long)local_44c + lVar10) = 0;
    *(undefined8 *)((long)local_44c + lVar10 + 8) = 0;
    *(undefined4 *)((long)&local_43c + lVar10) = 0x3f800000;
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0x440);
  for (lVar10 = 0; lVar10 != 0x440; lVar10 = lVar10 + 0x40) {
    *(undefined4 *)(local_478 + lVar10) = 0x3f800000;
    *(undefined8 *)(local_478 + lVar10 + 4) = 0;
    *(undefined8 *)(local_478 + lVar10 + 0xc) = 0;
    *(undefined4 *)(local_478 + lVar10 + 0x14) = 0x3f800000;
    *(undefined8 *)((long)apDStack_460 + lVar10) = 0;
    *(undefined8 *)((long)apDStack_460 + lVar10 + 8) = 0;
    *(undefined4 *)((long)&local_450 + lVar10) = 0x3f800000;
    *(undefined8 *)((long)local_44c + lVar10) = 0;
    *(undefined8 *)((long)local_44c + lVar10 + 8) = 0;
    *(undefined4 *)((long)&local_43c + lVar10) = 0x3f800000;
  }
  std::__cxx11::string::string((string *)&temp,"PreRotation",(allocator *)&nd);
  _Var19 = _S_red;
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_600 = aVar22.z;
  local_608 = aVar22._0_8_;
  uStack_6b0 = extraout_XMM0_Dc;
  local_6b8 = (undefined1  [8])local_608;
  uStack_6ac = extraout_XMM0_Dd;
  local_690 = (Model *)CONCAT44(local_690._4_4_,local_600);
  pFVar17 = (FBXConverter *)&temp;
  std::__cxx11::string::~string((string *)pFVar17);
  if (ok == true) {
    in_XMM1_Db = (float)local_6b8._4_4_;
    in_XMM1_Dc = uStack_6b0;
    in_XMM1_Dd = uStack_6ac;
    if (1.1920929e-07 <
        local_690._0_4_ * local_690._0_4_ +
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6b8._4_4_ * (float)local_6b8._4_4_) {
      GetRotationMatrix(pFVar17,RotOrder_EulerXYZ,(aiVector3D *)&local_608,&local_2f8);
      _Var19 = 0x40;
    }
  }
  std::__cxx11::string::string((string *)&temp,"PostRotation",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_610 = aVar22.z;
  local_618 = aVar22._0_8_;
  uStack_6b0 = extraout_XMM0_Dc_00;
  local_6b8 = (undefined1  [8])local_618;
  uStack_6ac = extraout_XMM0_Dd_00;
  local_690 = (Model *)CONCAT44(local_690._4_4_,local_610);
  pFVar17 = (FBXConverter *)&temp;
  std::__cxx11::string::~string((string *)pFVar17);
  if (ok == true) {
    in_XMM1_Db = (float)local_6b8._4_4_;
    in_XMM1_Dc = uStack_6b0;
    in_XMM1_Dd = uStack_6ac;
    if (1.1920929e-07 <
        local_690._0_4_ * local_690._0_4_ +
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6b8._4_4_ * (float)local_6b8._4_4_) {
      _Var19 = _Var19 | 0x100;
      GetRotationMatrix(pFVar17,RotOrder_EulerXYZ,(aiVector3D *)&local_618,&local_278);
    }
  }
  std::__cxx11::string::string((string *)&temp,"RotationPivot",(allocator *)&nd);
  local_690 = model;
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  uStack_6a0 = extraout_XMM0_Dc_01;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_01;
  local_6b8._4_4_ = in_XMM1_Db;
  local_6b8._0_4_ = aVar22.z;
  uStack_6b0 = in_XMM1_Dc;
  uStack_6ac = in_XMM1_Dd;
  std::__cxx11::string::~string((string *)&temp);
  if (ok == true) {
    in_XMM1_Db = (float)local_6b8._4_4_;
    in_XMM1_Dc = uStack_6b0;
    in_XMM1_Dd = uStack_6ac;
    if (1.1920929e-07 <
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6a8._4_4_ * (float)local_6a8._4_4_) {
      _Var19 = _Var19 | 0x220;
      local_338 = 0x3f800000;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      local_334 = 0;
      local_324 = 0x3f800000;
      uStack_318 = 0;
      local_310 = 0x3f800000;
      local_308 = 0;
      local_300 = 0x3f80000000000000;
      uStack_32c = (ulong)(uint)local_6a8._0_4_;
      local_320 = (ulong)(uint)local_6a8._4_4_ << 0x20;
      local_30c = (float)local_6b8._0_4_;
      local_20c = -(float)local_6b8._0_4_;
      local_238 = 0x3f800000;
      local_234 = 0;
      local_224 = 0x3f800000;
      uStack_218 = 0;
      local_210 = 0x3f800000;
      local_208 = 0;
      local_200 = 0x3f80000000000000;
      uStack_22c = (ulong)(uint)-(float)local_6a8._0_4_;
      local_220 = (ulong)(uint)-(float)local_6a8._4_4_ << 0x20;
    }
  }
  std::__cxx11::string::string((string *)&temp,"RotationOffset",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  uStack_6a0 = extraout_XMM0_Dc_02;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_02;
  local_6b8._0_4_ = aVar22.z;
  std::__cxx11::string::~string((string *)&temp);
  if (ok == true) {
    in_XMM1_Db = 0.0;
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    if (1.1920929e-07 <
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6a8._4_4_ * (float)local_6a8._4_4_) {
      _Var19 = _Var19 | 0x10;
      local_378 = 0x3f800000;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      local_374 = 0;
      local_364 = 0x3f800000;
      uStack_358 = 0;
      local_350 = 0x3f800000;
      local_348 = 0;
      local_340 = 0x3f80000000000000;
      uStack_36c = (ulong)(uint)local_6a8._0_4_;
      local_360 = (ulong)(uint)local_6a8._4_4_ << 0x20;
      local_34c = (float)local_6b8._0_4_;
    }
  }
  std::__cxx11::string::string((string *)&temp,"ScalingOffset",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_6b8._0_4_ = aVar22.z;
  uStack_6a0 = extraout_XMM0_Dc_03;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_03;
  std::__cxx11::string::~string((string *)&temp);
  if (ok == true) {
    in_XMM1_Db = 0.0;
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    if (1.1920929e-07 <
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6a8._4_4_ * (float)local_6a8._4_4_) {
      _Var19 = _Var19 | 0x400;
      local_1f8 = 0x3f800000;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      local_1f4 = 0;
      local_1e4 = 0x3f800000;
      uStack_1d8 = 0;
      local_1d0 = 0x3f800000;
      local_1c8 = 0;
      local_1c0 = 0x3f80000000000000;
      uStack_1ec = (ulong)(uint)local_6a8._0_4_;
      local_1e0 = (ulong)(uint)local_6a8._4_4_ << 0x20;
      local_1cc = (float)local_6b8._0_4_;
    }
  }
  std::__cxx11::string::string((string *)&temp,"ScalingPivot",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  uStack_6a0 = extraout_XMM0_Dc_04;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_04;
  local_6b8._4_4_ = in_XMM1_Db;
  local_6b8._0_4_ = aVar22.z;
  uStack_6b0 = in_XMM1_Dc;
  uStack_6ac = in_XMM1_Dd;
  std::__cxx11::string::~string((string *)&temp);
  if (ok == true) {
    in_XMM1_Db = (float)local_6b8._4_4_;
    in_XMM1_Dc = uStack_6b0;
    in_XMM1_Dd = uStack_6ac;
    if (1.1920929e-07 <
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6a8._4_4_ * (float)local_6a8._4_4_) {
      _Var19 = _Var19 | 0x2800;
      local_1b8 = 0x3f800000;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      local_1b4 = 0;
      local_1a4 = 0x3f800000;
      uStack_198 = 0;
      local_190 = 0x3f800000;
      local_188 = 0;
      local_180 = 0x3f80000000000000;
      uStack_1ac = (ulong)(uint)local_6a8._0_4_;
      local_1a0 = (ulong)(uint)local_6a8._4_4_ << 0x20;
      local_18c = (float)local_6b8._0_4_;
      local_10c = -(float)local_6b8._0_4_;
      local_138 = 0x3f800000;
      local_134 = 0;
      local_124 = 0x3f800000;
      uStack_118 = 0;
      local_110 = 0x3f800000;
      local_108 = 0;
      local_100 = 0x3f80000000000000;
      uStack_12c = (ulong)(uint)-(float)local_6a8._0_4_;
      local_120 = (ulong)(uint)-(float)local_6a8._4_4_ << 0x20;
    }
  }
  std::__cxx11::string::string((string *)&temp,"Lcl Translation",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  uStack_6a0 = extraout_XMM0_Dc_05;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_05;
  local_6b8._0_4_ = aVar22.z;
  std::__cxx11::string::~string((string *)&temp);
  if (ok == true) {
    in_XMM1_Db = 0.0;
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    if (1.1920929e-07 <
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6a8._4_4_ * (float)local_6a8._4_4_) {
      _Var19 = _Var19 | 8;
      local_3b8 = 0x3f800000;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      local_3b4 = 0;
      local_3a4 = 0x3f800000;
      uStack_398 = 0;
      local_390 = 0x3f800000;
      local_388 = 0;
      local_380 = 0x3f80000000000000;
      uStack_3ac = (ulong)(uint)local_6a8._0_4_;
      local_3a0 = (ulong)(uint)local_6a8._4_4_ << 0x20;
      local_38c = (float)local_6b8._0_4_;
    }
  }
  std::__cxx11::string::string((string *)&temp,"Lcl Scaling",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  uStack_6a0 = extraout_XMM0_Dc_06;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_06;
  local_6b8._0_4_ = aVar22.z;
  std::__cxx11::string::~string((string *)&temp);
  if (ok == true) {
    in_XMM1_Db = 0.0;
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    if (1.1920929e-07 <
        ((float)local_6b8._0_4_ + -1.0) * ((float)local_6b8._0_4_ + -1.0) +
        ((float)local_6a8._0_4_ + -1.0) * ((float)local_6a8._0_4_ + -1.0) +
        ((float)local_6a8._4_4_ + -1.0) * ((float)local_6a8._4_4_ + -1.0)) {
      _Var19 = _Var19 | 0x1000;
      in_XMM1_Db = 0.0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      local_174 = 0;
      uStack_16c = 0;
      local_160 = 0;
      uStack_158 = 0;
      local_14c = 0;
      uStack_144 = 0;
      local_13c = 0x3f800000;
      local_178 = (float)local_6a8._0_4_;
      local_164 = (float)local_6a8._4_4_;
      local_150 = (float)local_6b8._0_4_;
    }
  }
  std::__cxx11::string::string((string *)&temp,"Lcl Rotation",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_620 = aVar22.z;
  local_628 = aVar22._0_8_;
  uStack_6b0 = extraout_XMM0_Dc_07;
  local_6b8 = (undefined1  [8])local_628;
  uStack_6ac = extraout_XMM0_Dd_07;
  local_6a8._0_4_ = local_620;
  pFVar17 = (FBXConverter *)&temp;
  std::__cxx11::string::~string((string *)pFVar17);
  if (ok == true) {
    in_XMM1_Db = (float)local_6b8._4_4_;
    in_XMM1_Dc = uStack_6b0;
    in_XMM1_Dd = uStack_6ac;
    if (1.1920929e-07 <
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6b8._0_4_ * (float)local_6b8._0_4_ +
        (float)local_6b8._4_4_ * (float)local_6b8._4_4_) {
      _Var19 = _Var19 | 0x80;
      GetRotationMatrix(pFVar17,local_648._0_4_,(aiVector3D *)&local_628,&local_2b8);
    }
  }
  std::__cxx11::string::string((string *)&temp,"GeometricScaling",(allocator *)&nd);
  local_6b8 = (undefined1  [8])name;
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_694 = aVar22.z;
  uStack_6a0 = extraout_XMM0_Dc_08;
  local_6a8 = (undefined1  [8])aVar22._0_8_;
  uStack_69c = extraout_XMM0_Dd_08;
  std::__cxx11::string::~string((string *)&temp);
  _Var15 = _Var19;
  if (ok == true) {
    in_XMM1_Db = 0.0;
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    if (1.1920929e-07 <
        (local_694 + -1.0) * (local_694 + -1.0) +
        ((float)local_6a8._0_4_ + -1.0) * ((float)local_6a8._0_4_ + -1.0) +
        ((float)local_6a8._4_4_ + -1.0) * ((float)local_6a8._4_4_ + -1.0)) {
      _Var15 = _Var19 + 0x10000;
      local_74 = 0;
      uStack_6c = 0;
      local_60 = 0;
      uStack_58 = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_3c = 0x3f800000;
      local_78 = (float)local_6a8._0_4_;
      local_64 = (float)local_6a8._4_4_;
      local_50 = local_694;
      temp.a1 = (float)local_6a8._0_4_;
      nd = (aiNode *)CONCAT44(nd._4_4_,local_6a8._4_4_);
      local_660._0_4_ = local_694;
      iVar14 = 0;
      in_XMM1_Db = NAN;
      in_XMM1_Dc = 0x7fffffff;
      in_XMM1_Dd = 0x7fffffff;
      while( true ) {
        paVar12 = (aiMatrix4x4t<float> *)&nd;
        if (((iVar14 != 1) && (paVar12 = (aiMatrix4x4t<float> *)local_660, iVar14 != 2)) &&
           (paVar12 = &temp, iVar14 == 3)) {
          _Var15 = _Var19 | 0x10001;
          local_478._4_8_ = 0;
          local_478._12_8_ = 0;
          apDStack_460[0] = (Document *)0x0;
          apDStack_460[1] = (Document *)0x0;
          local_44c[0] = 0;
          local_44c[1] = 0;
          local_43c = 0x3f800000;
          local_478._0_4_ = temp.a1;
          local_478._20_4_ = nd._0_4_;
          local_450 = (float)local_660._0_4_;
          goto LAB_00507e66;
        }
        if (ABS(paVar12->a1) <= 1.1920929e-07) break;
        paVar12 = (aiMatrix4x4t<float> *)local_660;
        fVar21 = local_694;
        if ((iVar14 != 2) && (paVar12 = &temp, fVar21 = (float)local_6a8._0_4_, iVar14 == 1)) {
          paVar12 = (aiMatrix4x4t<float> *)&nd;
          fVar21 = (float)local_6a8._4_4_;
        }
        paVar12->a1 = 1.0 / fVar21;
        iVar14 = iVar14 + 1;
      }
      LogFunctions<Assimp::FBXImporter>::LogError((char *)0x507e01);
    }
  }
LAB_00507e66:
  this_00 = local_6b8;
  std::__cxx11::string::string((string *)&temp,"GeometricRotation",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_694 = aVar22.z;
  local_660._0_8_ = aVar22._0_8_;
  uStack_6a0 = extraout_XMM0_Dc_09;
  local_6a8 = (undefined1  [8])local_660._0_8_;
  uStack_69c = extraout_XMM0_Dd_09;
  pFVar17 = (FBXConverter *)&temp;
  local_660._8_4_ = local_694;
  std::__cxx11::string::~string((string *)pFVar17);
  if (ok == true) {
    in_XMM1_Db = (float)local_6a8._4_4_;
    in_XMM1_Dc = uStack_6a0;
    in_XMM1_Dd = uStack_69c;
    if (1.1920929e-07 <
        local_694 * local_694 +
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_6a8._4_4_ * (float)local_6a8._4_4_) {
      _Var15 = _Var15 | 0x8002;
      mode = local_648._0_4_;
      GetRotationMatrix(pFVar17,local_648._0_4_,(aiVector3D *)local_660,&local_b8);
      GetRotationMatrix(pFVar17,mode,(aiVector3D *)local_660,&local_438);
      aiMatrix4x4t<float>::Inverse(&local_438);
    }
  }
  std::__cxx11::string::string((string *)&temp,"GeometricTranslation",(allocator *)&nd);
  aVar22 = PropertyGet<aiVector3t<float>>(in,(string *)&temp,&ok,false);
  local_648._8_4_ = extraout_XMM0_Dc_10;
  local_648._0_8_ = aVar22._0_8_;
  local_648._12_4_ = extraout_XMM0_Dd_10;
  local_6a8._4_4_ = in_XMM1_Db;
  local_6a8._0_4_ = aVar22.z;
  uStack_6a0 = in_XMM1_Dc;
  uStack_69c = in_XMM1_Dd;
  pFVar17 = (FBXConverter *)&temp;
  std::__cxx11::string::~string((string *)pFVar17);
  if (ok == true) {
    if (1.1920929e-07 <
        (float)local_6a8._0_4_ * (float)local_6a8._0_4_ +
        (float)local_648._0_4_ * (float)local_648._0_4_ +
        (float)local_648._4_4_ * (float)local_648._4_4_) {
      _Var15 = _Var15 | 0x4004;
      local_f8 = 0x3f800000;
      local_f4 = 0;
      local_e4 = 0x3f800000;
      uStack_d8 = 0;
      local_d0 = 0x3f800000;
      local_c8 = 0;
      local_c0 = 0x3f80000000000000;
      uStack_ec = (ulong)(uint)local_648._0_4_;
      local_e0 = (ulong)(uint)local_648._4_4_ << 0x20;
      local_cc = (float)local_6a8._0_4_;
      local_3cc = -(float)local_6a8._0_4_;
      local_3f8 = 0x3f800000;
      local_3f4 = 0;
      local_3e4 = 0x3f800000;
      uStack_3d8 = 0;
      local_3d0 = 0x3f800000;
      local_3c8 = 0;
      local_3c0 = 0x3f80000000000000;
      uStack_3ec = (ulong)(uint)-(float)local_648._0_4_;
      local_3e0 = (ulong)(uint)-(float)local_648._4_4_ << 0x20;
    }
  }
  bVar9 = NeedsComplexTransformationChain(pFVar17,local_690);
  if (bVar9 != ((_Var15 & 0x1ef77) != _S_red)) {
    __assert_fail("NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXConverter.cpp"
                  ,0x326,
                  "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (((_Var15 & 0x1ef77) == _S_red) ||
     ((*(Document **)(local_660._16_8_ + 0x1a0))->settings->preservePivots != true)) {
    paVar13 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar13);
    nd = paVar13;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(local_668,&nd);
    paVar13 = nd;
    __n = (((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)((long)this_00 + 8))->
          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.super__Vector_impl_data.
          _M_start;
    if (__n < (pointer)0x400) {
      (nd->mName).length = (ai_uint32)__n;
      memcpy((nd->mName).data,*(void **)this_00,(size_t)__n);
      (paVar13->mName).data[(long)__n] = '\0';
    }
    for (lVar10 = 0; lVar10 != 0x440; lVar10 = lVar10 + 0x40) {
      temp.a1 = (nd->mTransformation).a1;
      temp.a2 = (nd->mTransformation).a2;
      temp.a3 = (nd->mTransformation).a3;
      temp.a4 = (nd->mTransformation).a4;
      temp.b1 = (nd->mTransformation).b1;
      temp.b2 = (nd->mTransformation).b2;
      temp.b3 = (nd->mTransformation).b3;
      temp.b4 = (nd->mTransformation).b4;
      temp.c1 = (nd->mTransformation).c1;
      temp.c2 = (nd->mTransformation).c2;
      temp.c3 = (nd->mTransformation).c3;
      temp.c4 = (nd->mTransformation).c4;
      temp.d1 = (nd->mTransformation).d1;
      temp.d2 = (nd->mTransformation).d2;
      temp.d3 = (nd->mTransformation).d3;
      temp.d4 = (nd->mTransformation).d4;
      aiMatrix4x4t<float>::operator*=(&temp,(aiMatrix4x4t<float> *)(local_478 + lVar10));
      (nd->mTransformation).a1 = temp.a1;
      (nd->mTransformation).a2 = temp.a2;
      (nd->mTransformation).a3 = temp.a3;
      (nd->mTransformation).a4 = temp.a4;
      (nd->mTransformation).b1 = temp.b1;
      (nd->mTransformation).b2 = temp.b2;
      (nd->mTransformation).b3 = temp.b3;
      (nd->mTransformation).b4 = temp.b4;
      (nd->mTransformation).c1 = temp.c1;
      (nd->mTransformation).c2 = temp.c2;
      (nd->mTransformation).c3 = temp.c3;
      (nd->mTransformation).c4 = temp.c4;
      (nd->mTransformation).d1 = temp.d1;
      (nd->mTransformation).d2 = temp.d2;
      (nd->mTransformation).d3 = temp.d3;
      (nd->mTransformation).d4 = temp.d4;
    }
    bVar9 = false;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nd,
                   "generating full transformation chain for node: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&temp,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nd);
    LogFunctions<Assimp::FBXImporter>::LogInfo((format *)&temp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&temp);
    std::__cxx11::string::~string((string *)&nd);
    uVar1 = local_660._16_8_;
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)(local_660._16_8_ + 0x128),(key_type *)this_00);
    if ((_Rb_tree_header *)iVar11._M_node ==
        &(((NodeAnimBitMap *)(uVar1 + 0x128))->_M_t)._M_impl.super__Rb_tree_header) {
      _Var19 = _S_red;
    }
    else {
      _Var19 = iVar11._M_node[2]._M_color;
    }
    _Var20 = _S_black;
    puVar16 = (undefined8 *)local_478;
    for (uVar18 = 0; uVar18 != 0x11; uVar18 = uVar18 + 1) {
      if ((_Var20 & (_Var15 | _Var19)) != _S_red) {
        if (uVar18 == 8) {
          paVar12 = aiMatrix4x4t<float>::Inverse(&local_278);
          local_278.a1 = paVar12->a1;
          local_278.a2 = paVar12->a2;
          local_278.a3 = paVar12->a3;
          local_278.a4 = paVar12->a4;
          local_278.b1 = paVar12->b1;
          local_278.b2 = paVar12->b2;
          local_278.b3 = paVar12->b3;
          local_278.b4 = paVar12->b4;
          local_278.c1 = paVar12->c1;
          local_278.c2 = paVar12->c2;
          local_278.c3 = paVar12->c3;
          local_278.c4 = paVar12->c4;
          local_278.d1 = paVar12->d1;
          local_278.d2 = paVar12->d2;
          local_278.d3 = paVar12->d3;
          local_278.d4 = paVar12->d4;
        }
        paVar13 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar13);
        nd = paVar13;
        NameTransformationChainNode
                  ((string *)&temp,(FBXConverter *)this_00,(string *)local_6b8,
                   (TransformationComp)uVar18);
        uVar1 = temp._8_8_;
        if ((ulong)temp._8_8_ < 0x400) {
          (paVar13->mName).length = (ai_uint32)temp.a3;
          memcpy((paVar13->mName).data,(void *)temp._0_8_,temp._8_8_);
          (paVar13->mName).data[uVar1] = '\0';
        }
        std::__cxx11::string::~string((string *)&temp);
        uVar1 = *puVar16;
        uVar2 = puVar16[1];
        uVar3 = puVar16[2];
        uVar4 = puVar16[3];
        uVar5 = puVar16[4];
        uVar6 = puVar16[5];
        uVar7 = puVar16[6];
        uVar8 = puVar16[7];
        (nd->mTransformation).d1 = (float)(int)uVar7;
        (nd->mTransformation).d2 = (float)(int)((ulong)uVar7 >> 0x20);
        (nd->mTransformation).d3 = (float)(int)uVar8;
        (nd->mTransformation).d4 = (float)(int)((ulong)uVar8 >> 0x20);
        (nd->mTransformation).c1 = (float)(int)uVar5;
        (nd->mTransformation).c2 = (float)(int)((ulong)uVar5 >> 0x20);
        (nd->mTransformation).c3 = (float)(int)uVar6;
        (nd->mTransformation).c4 = (float)(int)((ulong)uVar6 >> 0x20);
        (nd->mTransformation).b1 = (float)(int)uVar3;
        (nd->mTransformation).b2 = (float)(int)((ulong)uVar3 >> 0x20);
        (nd->mTransformation).b3 = (float)(int)uVar4;
        (nd->mTransformation).b4 = (float)(int)((ulong)uVar4 >> 0x20);
        (nd->mTransformation).a1 = (float)(int)uVar1;
        (nd->mTransformation).a2 = (float)(int)((ulong)uVar1 >> 0x20);
        (nd->mTransformation).a3 = (float)(int)uVar2;
        (nd->mTransformation).a4 = (float)(int)((ulong)uVar2 >> 0x20);
        this_01 = local_668;
        if (uVar18 < 3) {
          this_01 = local_630;
        }
        this_00 = (undefined1  [8])&nd;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(this_01,(value_type *)this_00);
      }
      _Var20 = _Var20 * 2;
      puVar16 = puVar16 + 8;
    }
    bVar9 = true;
    if ((local_668->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (local_668->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      __assert_fail("output_nodes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/FBX/FBXConverter.cpp"
                    ,0x350,
                    "bool Assimp::FBX::FBXConverter::GenerateTransformationNodeChain(const Model &, const std::string &, std::vector<aiNode *> &, std::vector<aiNode *> &)"
                   );
    }
  }
  return bVar9;
}

Assistant:

bool FBXConverter::GenerateTransformationNodeChain(const Model& model, const std::string& name, std::vector<aiNode*>& output_nodes,
            std::vector<aiNode*>& post_output_nodes) {
            const PropertyTable& props = model.Props();
            const Model::RotOrder rot = model.RotationOrder();

            bool ok;

            aiMatrix4x4 chain[TransformationComp_MAXIMUM];

            ai_assert(TransformationComp_MAXIMUM < 32);
            std::uint32_t chainBits = 0;
            // A node won't need a node chain if it only has these.
            const std::uint32_t chainMaskSimple = (1 << TransformationComp_Translation) + (1 << TransformationComp_Scaling) + (1 << TransformationComp_Rotation);
            // A node will need a node chain if it has any of these.
            const std::uint32_t chainMaskComplex = ((1 << (TransformationComp_MAXIMUM)) - 1) - chainMaskSimple;

            std::fill_n(chain, static_cast<unsigned int>(TransformationComp_MAXIMUM), aiMatrix4x4());

            // generate transformation matrices for all the different transformation components
            const float zero_epsilon = Math::getEpsilon<float>();
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);

            const aiVector3D& PreRotation = PropertyGet<aiVector3D>(props, "PreRotation", ok);
            if (ok && PreRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PreRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PreRotation, chain[TransformationComp_PreRotation]);
            }

            const aiVector3D& PostRotation = PropertyGet<aiVector3D>(props, "PostRotation", ok);
            if (ok && PostRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_PostRotation);

                GetRotationMatrix(Model::RotOrder::RotOrder_EulerXYZ, PostRotation, chain[TransformationComp_PostRotation]);
            }

            const aiVector3D& RotationPivot = PropertyGet<aiVector3D>(props, "RotationPivot", ok);
            if (ok && RotationPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationPivot) | (1 << TransformationComp_RotationPivotInverse);

                aiMatrix4x4::Translation(RotationPivot, chain[TransformationComp_RotationPivot]);
                aiMatrix4x4::Translation(-RotationPivot, chain[TransformationComp_RotationPivotInverse]);
            }

            const aiVector3D& RotationOffset = PropertyGet<aiVector3D>(props, "RotationOffset", ok);
            if (ok && RotationOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_RotationOffset);

                aiMatrix4x4::Translation(RotationOffset, chain[TransformationComp_RotationOffset]);
            }

            const aiVector3D& ScalingOffset = PropertyGet<aiVector3D>(props, "ScalingOffset", ok);
            if (ok && ScalingOffset.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingOffset);

                aiMatrix4x4::Translation(ScalingOffset, chain[TransformationComp_ScalingOffset]);
            }

            const aiVector3D& ScalingPivot = PropertyGet<aiVector3D>(props, "ScalingPivot", ok);
            if (ok && ScalingPivot.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_ScalingPivot) | (1 << TransformationComp_ScalingPivotInverse);

                aiMatrix4x4::Translation(ScalingPivot, chain[TransformationComp_ScalingPivot]);
                aiMatrix4x4::Translation(-ScalingPivot, chain[TransformationComp_ScalingPivotInverse]);
            }

            const aiVector3D& Translation = PropertyGet<aiVector3D>(props, "Lcl Translation", ok);
            if (ok && Translation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Translation);

                aiMatrix4x4::Translation(Translation, chain[TransformationComp_Translation]);
            }

            const aiVector3D& Scaling = PropertyGet<aiVector3D>(props, "Lcl Scaling", ok);
            if (ok && (Scaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Scaling);

                aiMatrix4x4::Scaling(Scaling, chain[TransformationComp_Scaling]);
            }

            const aiVector3D& Rotation = PropertyGet<aiVector3D>(props, "Lcl Rotation", ok);
            if (ok && Rotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_Rotation);

                GetRotationMatrix(rot, Rotation, chain[TransformationComp_Rotation]);
            }

            const aiVector3D& GeometricScaling = PropertyGet<aiVector3D>(props, "GeometricScaling", ok);
            if (ok && (GeometricScaling - all_ones).SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricScaling);
                aiMatrix4x4::Scaling(GeometricScaling, chain[TransformationComp_GeometricScaling]);
                aiVector3D GeometricScalingInverse = GeometricScaling;
                bool canscale = true;
                for (unsigned int i = 0; i < 3; ++i) {
                    if (std::fabs(GeometricScalingInverse[i]) > zero_epsilon) {
                        GeometricScalingInverse[i] = 1.0f / GeometricScaling[i];
                    }
                    else {
                        FBXImporter::LogError("cannot invert geometric scaling matrix with a 0.0 scale component");
                        canscale = false;
                        break;
                    }
                }
                if (canscale) {
                    chainBits = chainBits | (1 << TransformationComp_GeometricScalingInverse);
                    aiMatrix4x4::Scaling(GeometricScalingInverse, chain[TransformationComp_GeometricScalingInverse]);
                }
            }

            const aiVector3D& GeometricRotation = PropertyGet<aiVector3D>(props, "GeometricRotation", ok);
            if (ok && GeometricRotation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricRotation) | (1 << TransformationComp_GeometricRotationInverse);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotation]);
                GetRotationMatrix(rot, GeometricRotation, chain[TransformationComp_GeometricRotationInverse]);
                chain[TransformationComp_GeometricRotationInverse].Inverse();
            }

            const aiVector3D& GeometricTranslation = PropertyGet<aiVector3D>(props, "GeometricTranslation", ok);
            if (ok && GeometricTranslation.SquareLength() > zero_epsilon) {
                chainBits = chainBits | (1 << TransformationComp_GeometricTranslation) | (1 << TransformationComp_GeometricTranslationInverse);
                aiMatrix4x4::Translation(GeometricTranslation, chain[TransformationComp_GeometricTranslation]);
                aiMatrix4x4::Translation(-GeometricTranslation, chain[TransformationComp_GeometricTranslationInverse]);
            }

            // is_complex needs to be consistent with NeedsComplexTransformationChain()
            // or the interplay between this code and the animation converter would
            // not be guaranteed.
            ai_assert(NeedsComplexTransformationChain(model) == ((chainBits & chainMaskComplex) != 0));

            // now, if we have more than just Translation, Scaling and Rotation,
            // we need to generate a full node chain to accommodate for assimp's
            // lack to express pivots and offsets.
            if ((chainBits & chainMaskComplex) && doc.Settings().preservePivots) {
                FBXImporter::LogInfo("generating full transformation chain for node: " + name);

                // query the anim_chain_bits dictionary to find out which chain elements
                // have associated node animation channels. These can not be dropped
                // even if they have identity transform in bind pose.
                NodeAnimBitMap::const_iterator it = node_anim_chain_bits.find(name);
                const unsigned int anim_chain_bitmask = (it == node_anim_chain_bits.end() ? 0 : (*it).second);

                unsigned int bit = 0x1;
                for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                    const TransformationComp comp = static_cast<TransformationComp>(i);

                    if ((chainBits & bit) == 0 && (anim_chain_bitmask & bit) == 0) {
                        continue;
                    }

                    if (comp == TransformationComp_PostRotation) {
                        chain[i] = chain[i].Inverse();
                    }

                    aiNode* nd = new aiNode();
                    nd->mName.Set(NameTransformationChainNode(name, comp));
                    nd->mTransformation = chain[i];

                    // geometric inverses go in a post-node chain
                    if (comp == TransformationComp_GeometricScalingInverse ||
                        comp == TransformationComp_GeometricRotationInverse ||
                        comp == TransformationComp_GeometricTranslationInverse
                        ) {
                        post_output_nodes.push_back(nd);
                    }
                    else {
                        output_nodes.push_back(nd);
                    }
                }

                ai_assert(output_nodes.size());
                return true;
            }

            // else, we can just multiply the matrices together
            aiNode* nd = new aiNode();
            output_nodes.push_back(nd);

            // name passed to the method is already unique
            nd->mName.Set(name);

            for (const auto &transform : chain) {
                nd->mTransformation = nd->mTransformation * transform;
            }
            return false;
        }